

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::IndexFinder::find(IndexFinder *this,int molIndex)

{
  int in_EDX;
  long in_RSI;
  SelectionSet *in_RDI;
  SelectionSet *this_00;
  
  this_00 = in_RDI;
  std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::operator[]
            ((vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)(in_RSI + 8),
             (long)in_EDX);
  SelectionSet::SelectionSet(this_00,in_RDI);
  return this_00;
}

Assistant:

SelectionSet IndexFinder::find(int molIndex) {
#ifdef IS_MPI
    int proc;
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    proc = info_->getMolToProc(molIndex);

    if (proc == worldRank) {
#endif
      return selectionSets_[molIndex];
#ifdef IS_MPI
    } else {
      return SelectionSet(nObjects_);
    }
#endif
  }